

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O1

void * mmap_checked(size_t size,size_t align,int flags)

{
  void *pvVar1;
  void *pvVar2;
  int __flags;
  ulong uVar3;
  
  uVar3 = align - 1;
  if ((align & uVar3) != 0) {
    __assert_fail("(align & (align - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                  ,0x5b,"void *mmap_checked(size_t, size_t, int)");
  }
  if ((uVar3 & size) != 0) {
    __assert_fail("(size & (align - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                  ,0x5d,"void *mmap_checked(size_t, size_t, int)");
  }
  __flags = ((~flags & 0x80000001U) == 0) + 0x21;
  pvVar1 = mmap((void *)0x0,size,3,__flags,-1,0);
  pvVar2 = (void *)0x0;
  if ((pvVar1 != (void *)0xffffffffffffffff) && (pvVar2 = pvVar1, (uVar3 & (ulong)pvVar1) != 0)) {
    munmap_checked(pvVar1,size);
    pvVar1 = mmap((void *)0x0,align + size,3,__flags,-1,0);
    pvVar2 = (void *)0x0;
    if (pvVar1 != (void *)0xffffffffffffffff) {
      uVar3 = uVar3 & (ulong)pvVar1;
      if (uVar3 != 0) {
        munmap_checked(pvVar1,align - uVar3);
        pvVar1 = (void *)((long)pvVar1 + (align - uVar3));
        align = uVar3;
      }
      munmap_checked((void *)(size + (long)pvVar1),align);
      pvVar2 = pvVar1;
    }
  }
  return pvVar2;
}

Assistant:

static void *
mmap_checked(size_t size, size_t align, int flags)
{
	/* The alignment must be a power of two. */
	assert((align & (align - 1)) == 0);
	/* The size must be a multiple of alignment */
	assert((size & (align - 1)) == 0);

	if (IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_PRIVATE))
		flags = MAP_PRIVATE | MAP_ANONYMOUS;
	else
		flags = MAP_SHARED | MAP_ANONYMOUS;

	/*
	 * All mappings except the first are likely to
	 * be aligned already.  Be optimistic by trying
	 * to map exactly the requested amount.
	 */
	void *map = mmap(NULL, size, PROT_READ | PROT_WRITE, flags, -1, 0);
	if (map == MAP_FAILED)
		return NULL;
	if (((intptr_t) map & (align - 1)) == 0)
		return map;
	munmap_checked(map, size);

	/*
	 * mmap enough amount to be able to align
	 * the mapped address.  This can lead to virtual memory
	 * fragmentation depending on the kernels allocation
	 * strategy.
	 */
	map = mmap(NULL, size + align, PROT_READ | PROT_WRITE, flags, -1, 0);
	if (map == MAP_FAILED)
		return NULL;

	/* Align the mapped address around slab size. */
	size_t offset = (intptr_t) map & (align - 1);

	if (offset != 0) {
		/* Unmap unaligned prefix and postfix. */
		munmap_checked(map, align - offset);
		map += align - offset;
		munmap_checked(map + size, offset);
	} else {
		/* The address is returned aligned. */
		munmap_checked(map + size, align);
	}
	return map;
}